

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O3

void Image_Function::Sobel
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  uint uVar8;
  long lVar9;
  imageException *this;
  ulong uVar10;
  uchar *puVar11;
  uint uVar12;
  uint uVar13;
  EVP_PKEY_CTX *src;
  ulong uVar14;
  uchar *puVar15;
  uchar *__s;
  uchar *puVar16;
  uchar *puVar17;
  uint uVar18;
  uchar *puVar19;
  uchar *puVar20;
  uchar *puVar21;
  uchar *puVar22;
  long lVar23;
  uchar *puVar24;
  uint uVar25;
  ulong uVar26;
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  if ((2 < width) && (2 < height)) {
    uVar3 = in->_width;
    uVar4 = in->_height;
    uVar12 = startXIn + 1 + width;
    uVar5 = in->_rowSize;
    uVar10 = (ulong)uVar5;
    uVar26 = (ulong)(startXIn != 0);
    uVar13 = startYIn + 1 + height;
    uVar18 = (startXIn != 0 | 0xfffffffe) + width + (uint)(uVar12 < uVar3);
    uVar6 = out->_rowSize;
    puVar7 = in->_data;
    __s = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar6);
    if (startYIn == 0) {
      memset(__s,0,(ulong)width);
      __s = __s + uVar6;
    }
    uVar25 = (height + (startYIn != 0) + (uint)(uVar13 < uVar4) + -2) * uVar5;
    if (Sobel(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)
        ::kernel == '\0') {
      Sobel();
    }
    if (uVar25 != 0) {
      uVar14 = (ulong)(((startYIn + 1) - (uint)(startYIn != 0)) * uVar5);
      lVar9 = (uVar14 + startXIn) - uVar26;
      lVar23 = startXIn - uVar26;
      puVar11 = puVar7 + lVar9 + 1;
      lVar2 = lVar23 + uVar14;
      lVar23 = uVar14 + 1 + lVar23;
      puVar21 = puVar7 + lVar2;
      puVar17 = puVar7 + lVar2 + uVar10 + 1;
      puVar16 = puVar7 + (ulong)(uVar5 - 1) + lVar2 + 1;
      puVar24 = puVar7 + lVar2 + (ulong)(uVar5 + 1) + 1;
      puVar19 = puVar7 + (lVar23 - uVar10);
      puVar20 = puVar7 + (lVar23 - (ulong)(uVar5 - 1));
      puVar15 = puVar7 + (lVar23 - (ulong)(uVar5 + 1));
      do {
        puVar22 = __s;
        if (startXIn == 0) {
          puVar22 = __s + 1;
          *__s = '\0';
        }
        if (uVar18 != 0) {
          uVar26 = 0;
          do {
            uVar5 = ((((uint)puVar15[uVar26] - (uint)puVar24[uVar26]) + (uint)puVar16[uVar26]) -
                    (uint)puVar20[uVar26]) + ((uint)puVar21[uVar26] - (uint)puVar21[uVar26 + 2]) * 2
            ;
            uVar1 = (((uint)puVar15[uVar26] - (uint)puVar24[uVar26]) - (uint)puVar16[uVar26]) +
                    (uint)puVar20[uVar26] + ((uint)puVar19[uVar26] - (uint)puVar17[uVar26]) * 2;
            uVar8 = -uVar5;
            if (0 < (int)uVar5) {
              uVar8 = uVar5;
            }
            uVar5 = -uVar1;
            if (0 < (int)uVar1) {
              uVar5 = uVar1;
            }
            puVar22[uVar26] = Sobel::kernel.kernel[uVar8][uVar5];
            uVar26 = uVar26 + 1;
          } while (uVar18 != uVar26);
          puVar22 = puVar22 + uVar26;
        }
        if (uVar3 <= uVar12) {
          *puVar22 = '\0';
        }
        __s = __s + uVar6;
        puVar11 = puVar11 + uVar10;
        puVar17 = puVar17 + uVar10;
        puVar19 = puVar19 + uVar10;
        puVar21 = puVar21 + uVar10;
        puVar20 = puVar20 + uVar10;
        puVar16 = puVar16 + uVar10;
        puVar24 = puVar24 + uVar10;
        puVar15 = puVar15 + uVar10;
      } while (puVar11 != puVar7 + (ulong)uVar25 + lVar9 + 1);
    }
    if (uVar4 <= uVar13) {
      memset(__s,0,(ulong)width);
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Input image is very small for Sobel filter to be applied");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Sobel( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if( width < 3 || height < 3 )
            throw imageException( "Input image is very small for Sobel filter to be applied" );

        const uint32_t startXOffset = (startXIn > 0u) ? 1u : 0u;
        const uint32_t startYOffset = (startYIn > 0u) ? 1u : 0u;
        const uint32_t endXOffset   = ((startXIn + width  + 1u) < in.width ()) ? 1u : 0u;
        const uint32_t endYOffset   = ((startYIn + height + 1u) < in.height()) ? 1u : 0u;

        // Create the map of gradient values
        const uint32_t gradientWidth  = width  - ( ((startXOffset > 0u) ? 0u : 1u) + ((endXOffset > 0u) ? 0u : 1u) );
        const uint32_t gradientHeight = height - ( ((startYOffset > 0u) ? 0u : 1u) + ((endYOffset > 0u) ? 0u : 1u) );

        const float multiplier = 1.0f / ( 4.0f * sqrtf( 2.0f ) );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + (startYIn + 1u - startYOffset) * rowSizeIn + startXIn + 1u - startXOffset;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * inYEnd = inY + gradientHeight * rowSizeIn;

        if ( startYOffset == 0u ) {
            // fill top row with zeros
            memset( outY, 0, width );
            outY += rowSizeOut;
        }

        const uint32_t yPlusX  = rowSizeIn + 1u;
        const uint32_t yMinusX = rowSizeIn - 1u;
        static const FilterKernel<4u> kernel(multiplier);

        for( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut ) {
            uint8_t       * outX   = outY;

            if ( startXOffset == 0u ) {
                // set first pixel in row to 0
                *outX = 0;
                ++outX;
            }

            const uint8_t * inX    = inY;
            const uint8_t * inXEnd = inX + gradientWidth;

            for( ; inX != inXEnd; ++inX, ++outX ) {
                //      | +1  0 -1|
                // Gx = | +2  0 -2|
                //      | +1  0 -1|

                //      | +1 +2 +1|
                // Gy = |  0  0  0|
                //      | -1 -2 -1|

                const int32_t partialG = static_cast<int32_t>(*(inX - yPlusX )) - *(inX + yPlusX ); // [y - 1; x - 1] - [y + 1; x + 1]

                const int32_t gX = partialG + *(inX + yMinusX) - *(inX - yMinusX) + 2 * ( static_cast<int32_t>(*(inX - 1        )) - (*(inX + 1        )) );
                const int32_t gY = partialG + *(inX - yMinusX) - *(inX + yMinusX) + 2 * ( static_cast<int32_t>(*(inX - rowSizeIn)) - (*(inX + rowSizeIn)) );

                *outX = kernel.kernel[(gX < 0) ? -gX : gX][(gY < 0) ? -gY : gY];
            }

            if ( endXOffset == 0u ) {
                // set last pixel in row to 0
                *outX = 0;
            }
        }

        if ( endYOffset == 0u ) {
            // fill bottom row with zeros
            memset( outY, 0, width );
        }
    }